

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_ManTimeStop(Abc_ManTime_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  
  if (p->tInDrive != (Abc_Time_t *)0x0) {
    free(p->tInDrive);
    p->tInDrive = (Abc_Time_t *)0x0;
  }
  if (p->tOutLoad != (Abc_Time_t *)0x0) {
    free(p->tOutLoad);
    p->tOutLoad = (Abc_Time_t *)0x0;
  }
  if ((0 < p->vArrs->nSize) && (pvVar1 = *p->vArrs->pArray, pvVar1 != (void *)0x0)) {
    free(pvVar1);
    *p->vArrs->pArray = (void *)0x0;
  }
  pVVar2 = p->vArrs;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  if ((0 < p->vReqs->nSize) && (pvVar1 = *p->vReqs->pArray, pvVar1 != (void *)0x0)) {
    free(pvVar1);
    *p->vReqs->pArray = (void *)0x0;
  }
  pVVar2 = p->vReqs;
  if (pVVar2->pArray != (void **)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (void **)0x0;
  }
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    free(pVVar2);
  }
  if (p != (Abc_ManTime_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abc_ManTimeStop( Abc_ManTime_t * p )
{
    if ( p->tInDrive )
        ABC_FREE( p->tInDrive );
    if ( p->tOutLoad )
        ABC_FREE( p->tOutLoad );
    if ( Vec_PtrSize(p->vArrs) > 0 )
        ABC_FREE( p->vArrs->pArray[0] );
    Vec_PtrFree( p->vArrs );
    if ( Vec_PtrSize(p->vReqs) > 0 )
        ABC_FREE( p->vReqs->pArray[0] );
    Vec_PtrFree( p->vReqs );
    ABC_FREE( p );
}